

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O0

uint32_t __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<2>::GetAxis
          (DynamicIntegerPointsKdTreeDecoder<2> *this,uint32_t num_remaining_points,
          VectorUint32 *levels,uint32_t last_axis)

{
  uint32_t local_24;
  uint32_t last_axis_local;
  VectorUint32 *levels_local;
  uint32_t num_remaining_points_local;
  DynamicIntegerPointsKdTreeDecoder<2> *this_local;
  
  if (last_axis == this->dimension_ - 1) {
    local_24 = 0;
  }
  else {
    local_24 = last_axis + 1;
  }
  return local_24;
}

Assistant:

uint32_t DynamicIntegerPointsKdTreeDecoder<compression_level_t>::GetAxis(
    uint32_t num_remaining_points, const VectorUint32 &levels,
    uint32_t last_axis) {
  if (!Policy::select_axis) {
    return DRACO_INCREMENT_MOD(last_axis, dimension_);
  }

  uint32_t best_axis = 0;
  if (num_remaining_points < 64) {
    for (uint32_t axis = 1; axis < dimension_; ++axis) {
      if (levels[best_axis] > levels[axis]) {
        best_axis = axis;
      }
    }
  } else {
    axis_decoder_.DecodeLeastSignificantBits32(4, &best_axis);
  }

  return best_axis;
}